

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall soul::heart::Constant::Constant(Constant *this,CodeLocation *l,Value *v)

{
  CodeLocation local_30;
  Value *local_20;
  Value *v_local;
  CodeLocation *l_local;
  Constant *this_local;
  
  local_20 = v;
  v_local = (Value *)l;
  l_local = (CodeLocation *)this;
  CodeLocation::CodeLocation(&local_30,l);
  Expression::Expression(&this->super_Expression,&local_30);
  CodeLocation::~CodeLocation(&local_30);
  (this->super_Expression).super_Object._vptr_Object = (_func_int **)&PTR__Constant_0058aea0;
  soul::Value::Value(&this->value,v);
  return;
}

Assistant:

Constant (CodeLocation l, Value v) : Expression (std::move (l)), value (std::move (v)) {}